

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

group * __thiscall
clipp::group::depth_first_traverser::outermost_blocking_group_fully_explored
          (depth_first_traverser *this)

{
  bool bVar1;
  group *this_00;
  const_reverse_iterator i;
  group *g;
  pointer in_stack_ffffffffffffff98;
  pointer in_stack_ffffffffffffffa0;
  pointer in_stack_ffffffffffffffa8;
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  *in_stack_ffffffffffffffb0;
  group *local_18;
  group *local_8;
  
  bVar1 = std::
          vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
          ::empty(in_stack_ffffffffffffffb0);
  if (bVar1) {
    local_8 = (group *)0x0;
  }
  else {
    local_18 = (group *)0x0;
    std::
    vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
    ::rbegin((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              *)in_stack_ffffffffffffffa8);
    while( true ) {
      std::
      vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
      ::rend((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
              *)in_stack_ffffffffffffffa8);
      bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                               *)in_stack_ffffffffffffffa0,
                              (reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                               *)in_stack_ffffffffffffff98);
      if (!bVar1) break;
      this_00 = (group *)std::
                         reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                         ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                                       *)in_stack_ffffffffffffffa0);
      __gnu_cxx::
      __normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
      ::operator+((__normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                   *)in_stack_ffffffffffffffa8,(difference_type)in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffa8 =
           std::
           reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                         *)in_stack_ffffffffffffffa0);
      bVar1 = __gnu_cxx::operator==
                        ((__normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                          *)in_stack_ffffffffffffffa0,
                         (__normal_iterator<const_clipp::group::child_t<clipp::parameter,_clipp::group>_*,_std::vector<clipp::group::child_t<clipp::parameter,_clipp::group>,_std::allocator<clipp::group::child_t<clipp::parameter,_clipp::group>_>_>_>
                          *)in_stack_ffffffffffffff98);
      if (!bVar1) {
        return local_18;
      }
      in_stack_ffffffffffffffa0 =
           std::
           reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                         *)in_stack_ffffffffffffffa0);
      bVar1 = blocking(this_00);
      if (bVar1) {
        in_stack_ffffffffffffff98 =
             std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                           *)in_stack_ffffffffffffffa0);
        local_18 = in_stack_ffffffffffffff98->parent;
      }
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
      ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_clipp::group::depth_first_traverser::context_*,_std::vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>_>_>
                    *)in_stack_ffffffffffffffa0);
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

const group*
        outermost_blocking_group_fully_explored() const noexcept {
            if(stack_.empty()) return nullptr;

            const group* g = nullptr;
            for(auto i = stack_.rbegin(); i != stack_.rend(); ++i) {
                if(i->cur+1 == i->end) {
                    if(i->parent->blocking()) g = i->parent;
                } else {
                    return g;
                }
            }
            return g;
        }